

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O2

void __thiscall arangodb::velocypack::HexDump::~HexDump(HexDump *this)

{
  std::__cxx11::string::~string((string *)&this->header);
  std::__cxx11::string::~string((string *)&this->separator);
  return;
}

Assistant:

HexDump() = delete;